

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo3(Segment *this)

{
  double dVar1;
  double dVar2;
  __type _Var3;
  __type _Var4;
  __type _Var5;
  uint64_t local_98 [10];
  double local_48;
  double m10;
  uint64_t local_38;
  double local_30;
  double m01;
  uint64_t local_20;
  double local_18;
  double m00;
  Segment *this_local;
  
  local_20 = 0;
  m01 = 0.0;
  m00 = (double)this;
  local_18 = getNormalMoment(this,&local_20,(uint64_t *)&m01);
  local_38 = 0;
  m10 = 4.94065645841247e-324;
  local_30 = getNormalMoment(this,&local_38,(uint64_t *)&m10);
  local_98[9] = 1;
  local_98[8] = 0;
  local_48 = getNormalMoment(this,local_98 + 9,local_98 + 8);
  local_98[7] = 3;
  local_98[6] = 0;
  dVar1 = getCentralMoment(this,local_98 + 7,local_98 + 6,&local_18,&local_48,&local_30);
  local_98[5] = 1;
  local_98[4] = 2;
  dVar2 = getCentralMoment(this,local_98 + 5,local_98 + 4,&local_18,&local_48,&local_30);
  _Var3 = std::pow<double,int>(dVar1 + -(dVar2 * 3.0),2);
  local_98[3] = 2;
  local_98[2] = 1;
  dVar1 = getCentralMoment(this,local_98 + 3,local_98 + 2,&local_18,&local_48,&local_30);
  local_98[1] = 0;
  local_98[0] = 3;
  dVar2 = getCentralMoment(this,local_98 + 1,local_98,&local_18,&local_48,&local_30);
  _Var4 = std::pow<double,int>(dVar1 * 3.0 + -(dVar2 * 1.0),2);
  _Var5 = std::pow<double,int>(local_18,5);
  return (_Var3 + _Var4) / _Var5;
}

Assistant:

const double
Segment::getHuMomentInvariantNo3()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            std::pow(
                (
                    (1 * this->getCentralMoment(3, 0, m00, m10, m01)) -
                    (3 * this->getCentralMoment(1, 2, m00, m10, m01))
                ),
                2
            )
            +
            std::pow(
                (
                    (3 * this->getCentralMoment(2, 1, m00, m10, m01)) -
                    (1 * this->getCentralMoment(0, 3, m00, m10, m01))
                ),
                2
            )
        )
        /
        std::pow(m00, 5)
    );
}